

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.h
# Opt level: O2

bool filesystem::create_directory(path *p)

{
  bool bVar1;
  __mode_t __mask;
  int iVar2;
  bool bVar3;
  string local_38;
  
  bVar1 = path::is_directory(p);
  bVar3 = true;
  if (!bVar1) {
    __mask = umask(0);
    path::str_abi_cxx11_(&local_38,p,native_path);
    iVar2 = mkdir(local_38._M_dataplus._M_p,0x1ff);
    std::__cxx11::string::~string((string *)&local_38);
    umask(__mask);
    bVar3 = iVar2 == 0;
  }
  return bVar3;
}

Assistant:

inline bool create_directory(const path& p) {
    //// Radu: Do nothing if directory already exists.
    ////       This is consistent with std::experimental::filesystem::create_directory in C++17
    if (p.is_directory())
        return true;

#if defined(_WIN32)
    return CreateDirectoryW(p.wstr().c_str(), NULL) != 0;
#else
    auto old_umask = umask(0);
    auto flag = mkdir(p.str().c_str(), 0777);
    umask(old_umask);
    return flag == 0;
#endif
}